

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_bfop_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *s_00;
  TCGv_i32 arg1;
  byte bVar2;
  uint32_t uVar3;
  TCGTemp *pTVar4;
  TCGv_i32 ret;
  TCGv_i32 arg2;
  sbyte sVar5;
  uintptr_t o_6;
  uint uVar6;
  uintptr_t o_1;
  TCGOpcode opc;
  uint arg2_00;
  uint uVar7;
  uintptr_t o_2;
  uint uVar8;
  uintptr_t o_4;
  TCGv_i32 ret_00;
  uintptr_t o;
  TCGv_i32 local_88;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s_00 = s->uc->tcg_ctx;
  uVar3 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  arg1 = s_00->cpu_dregs[insn & 7];
  uVar6 = uVar3 - 1 & 0x1f;
  uVar8 = uVar3 >> 6;
  uVar7 = insn & 0xf00;
  if (uVar7 == 0xd00) {
    pTVar4 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    local_88 = (TCGv_i32)((long)pTVar4 - (long)s_00);
    pTVar4 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar4 - (long)s_00);
  }
  else {
    ret = (TCGv_i32)0x0;
    local_88 = (TCGv_i32)0x0;
  }
  uVar1 = uVar6 + 1;
  arg2_00 = uVar8 & 0x1f;
  sVar5 = (sbyte)uVar6;
  if ((uVar3 & 0x820) == 0) {
    if (uVar1 + arg2_00 < 0x21) {
      tcg_gen_shli_i32_m68k(s_00,QREG_CC_N,arg1,arg2_00);
    }
    else {
      tcg_gen_rotli_i32_m68k(s_00,QREG_CC_N,arg1,arg2_00);
    }
    tcg_gen_andi_i32_m68k(s_00,QREG_CC_N,QREG_CC_N,-0x80000000 >> sVar5);
    bVar2 = (byte)uVar8 & 0x1f;
    arg2 = tcg_const_i32_m68k(s_00,(0x7fffffffU >> sVar5) >> bVar2 |
                                   (0x7fffffffU >> sVar5) << 0x20 - bVar2);
    if (local_88 != (TCGv_i32)0x0) {
      tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)(local_88 + (long)&s_00->pool_cur),
                       (TCGArg)(ulong)arg2_00);
      tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)(ret + (long)&s_00->pool_cur),(ulong)uVar1);
    }
    goto LAB_006fef13;
  }
  pTVar4 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar4 - (long)s_00);
  if ((uVar3 & 0x20) == 0) {
    arg2 = tcg_const_i32_m68k(s_00,0x7fffffff >> sVar5);
    if (ret != (TCGv_i32)0x0) {
      tcg_gen_op2_m68k(s_00,INDEX_op_movi_i32,(TCGArg)(ret + (long)&s_00->pool_cur),(ulong)uVar1);
    }
  }
  else {
    tcg_gen_subi_i32_m68k(s_00,ret_00,s_00->cpu_dregs[uVar3 & 7],1);
    tcg_gen_andi_i32_m68k(s_00,ret_00,ret_00,0x1f);
    arg2 = tcg_const_i32_m68k(s_00,0x7fffffff);
    tcg_gen_op3_m68k(s_00,INDEX_op_shr_i32,(TCGArg)(arg2 + (long)s_00),(TCGArg)(arg2 + (long)s_00),
                     (TCGArg)pTVar4);
    if (ret != (TCGv_i32)0x0) {
      tcg_gen_addi_i32_m68k(s_00,ret,ret_00,1);
    }
  }
  if ((uVar3 >> 0xb & 1) == 0) {
    tcg_gen_rotli_i32_m68k(s_00,QREG_CC_N,arg1,arg2_00);
    tcg_gen_andc_i32_m68k(s_00,QREG_CC_N,QREG_CC_N,arg2);
    tcg_gen_rotri_i32_m68k(s_00,arg2,arg2,arg2_00);
    if (local_88 != (TCGv_i32)0x0) {
      opc = INDEX_op_movi_i32;
      pTVar4 = (TCGTemp *)(ulong)arg2_00;
LAB_006fee87:
      tcg_gen_op2_m68k(s_00,opc,(TCGArg)(local_88 + (long)&s_00->pool_cur),(TCGArg)pTVar4);
    }
  }
  else {
    tcg_gen_andi_i32_m68k(s_00,ret_00,s_00->cpu_dregs[uVar8 & 7],0x1f);
    tcg_gen_rotl_i32_m68k(s_00,QREG_CC_N,arg1,ret_00);
    tcg_gen_andc_i32_m68k(s_00,QREG_CC_N,QREG_CC_N,arg2);
    tcg_gen_rotr_i32_m68k(s_00,arg2,arg2,ret_00);
    if ((local_88 != (TCGv_i32)0x0) && (local_88 != ret_00)) {
      opc = INDEX_op_mov_i32;
      goto LAB_006fee87;
    }
  }
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_00 + (long)s_00));
LAB_006fef13:
  set_cc_op(s,CC_OP_LOGIC);
  switch(uVar7 - 0x800 >> 8) {
  case 0:
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
               ,0x1107,(char *)0x0);
  case 2:
    tcg_gen_eqv_i32_m68k(s_00,arg1,arg1,arg2);
    break;
  case 4:
    tcg_gen_op3_m68k(s_00,INDEX_op_and_i32,(TCGArg)(arg1 + (long)s_00),(TCGArg)(arg1 + (long)s_00),
                     (TCGArg)(arg2 + (long)&s_00->pool_cur));
    break;
  case 5:
    local_48 = (TCGTemp *)(QREG_CC_N + (long)s_00);
    local_40 = (TCGTemp *)(local_88 + (long)s_00);
    local_38 = (TCGTemp *)(ret + (long)s_00);
    tcg_gen_callN_m68k(s_00,helper_bfffo_reg_m68k,
                       (TCGTemp *)
                       ((long)&s_00->pool_cur +
                       *(long *)((long)s_00->cpu_dregs + (ulong)(uVar3 >> 9 & 0x38))),3,&local_48);
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(local_88 + (long)s_00));
    break;
  case 6:
    tcg_gen_orc_i32_m68k(s_00,arg1,arg1,arg2);
  }
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(arg2 + (long)s_00));
  return;
}

Assistant:

DISAS_INSN(bfop_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    TCGv src = DREG(insn, 0);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    TCGv mask, tofs, tlen;

    tofs = NULL;
    tlen = NULL;
    if ((insn & 0x0f00) == 0x0d00) { /* bfffo */
        tofs = tcg_temp_new(tcg_ctx);
        tlen = tcg_temp_new(tcg_ctx);
    }

    if ((ext & 0x820) == 0) {
        /* Immediate width and offset.  */
        uint32_t maski = 0x7fffffffu >> (len - 1);
        if (ofs + len <= 32) {
            tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, ofs);
        } else {
            tcg_gen_rotli_i32(tcg_ctx, QREG_CC_N, src, ofs);
        }
        tcg_gen_andi_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, ~maski);
        mask = tcg_const_i32(tcg_ctx, ror32(maski, ofs));
        if (tofs) {
            tcg_gen_movi_i32(tcg_ctx, tofs, ofs);
            tcg_gen_movi_i32(tcg_ctx, tlen, len);
        }
    } else {
        TCGv tmp = tcg_temp_new(tcg_ctx);
        if (ext & 0x20) {
            /* Variable width */
            tcg_gen_subi_i32(tcg_ctx, tmp, DREG(ext, 0), 1);
            tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 31);
            mask = tcg_const_i32(tcg_ctx, 0x7fffffffu);
            tcg_gen_shr_i32(tcg_ctx, mask, mask, tmp);
            if (tlen) {
                tcg_gen_addi_i32(tcg_ctx, tlen, tmp, 1);
            }
        } else {
            /* Immediate width */
            mask = tcg_const_i32(tcg_ctx, 0x7fffffffu >> (len - 1));
            if (tlen) {
                tcg_gen_movi_i32(tcg_ctx, tlen, len);
            }
        }
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, QREG_CC_N, src, tmp);
            tcg_gen_andc_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, mask);
            tcg_gen_rotr_i32(tcg_ctx, mask, mask, tmp);
            if (tofs) {
                tcg_gen_mov_i32(tcg_ctx, tofs, tmp);
            }
        } else {
            /* Immediate offset (and variable width) */
            tcg_gen_rotli_i32(tcg_ctx, QREG_CC_N, src, ofs);
            tcg_gen_andc_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, mask);
            tcg_gen_rotri_i32(tcg_ctx, mask, mask, ofs);
            if (tofs) {
                tcg_gen_movi_i32(tcg_ctx, tofs, ofs);
            }
        }
        tcg_temp_free(tcg_ctx, tmp);
    }
    set_cc_op(s, CC_OP_LOGIC);

    switch (insn & 0x0f00) {
    case 0x0a00: /* bfchg */
        tcg_gen_eqv_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0c00: /* bfclr */
        tcg_gen_and_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0d00: /* bfffo */
        gen_helper_bfffo_reg(tcg_ctx, DREG(ext, 12), QREG_CC_N, tofs, tlen);
        tcg_temp_free(tcg_ctx, tlen);
        tcg_temp_free(tcg_ctx, tofs);
        break;
    case 0x0e00: /* bfset */
        tcg_gen_orc_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0800: /* bftst */
        /* flags already set; no other work to do.  */
        break;
    default:
        g_assert_not_reached();
    }
    tcg_temp_free(tcg_ctx, mask);
}